

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (default_cost_type<double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  double p2y;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  _Var1;
  pointer ppVar2;
  bool bVar3;
  type pdVar4;
  reference pvVar5;
  iterator iVar6;
  difference_type dVar7;
  pointer ppVar8;
  iterator iVar9;
  difference_type value_00;
  pointer __first;
  pointer pdVar10;
  double *pdVar11;
  double dVar12;
  int local_13c;
  int i_2;
  double div;
  int i_1;
  double value;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_d0;
  pair<double,_int> *local_c8;
  pair<double,_int> *local_c0;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_b8;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_b0;
  pair<double,_int> *local_a8;
  pair<double,_int> *local_a0;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_98;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_90;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  next;
  iterator end;
  iterator begin;
  pair<double,_int> local_60;
  int local_50 [2];
  int i;
  allocator<std::pair<double,_int>_> local_39;
  undefined1 local_38 [8];
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> r;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng_local;
  int n_local;
  default_cost_type<double> *this_local;
  
  r.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)rng;
  std::allocator<std::pair<double,_int>_>::allocator(&local_39);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)local_38,
             (long)n,&local_39);
  std::allocator<std::pair<double,_int>_>::~allocator(&local_39);
  for (local_50[0] = 0; local_50[0] != n; local_50[0] = local_50[0] + 1) {
    pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->linear_elements,(long)local_50[0]);
    std::pair<double,_int>::pair<double_&,_int_&,_true>(&local_60,pdVar4,local_50);
    pvVar5 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        local_38,(long)local_50[0]);
    std::pair<double,_int>::operator=(pvVar5,&local_60);
  }
  iVar6 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                    ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                     local_38);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,baryonyx::itm::default_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar6._M_current);
  end = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                  ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                   local_38);
  next._M_current =
       (pair<double,_int> *)
       std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                 ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                  local_38);
  local_98._M_current =
       (pair<double,_int> *)
       std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                 ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                  local_38);
  local_90 = __gnu_cxx::
             __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
             ::operator++(&local_98,0);
  while (bVar3 = __gnu_cxx::
                 operator==<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                           (&local_90,&next), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppVar8 = __gnu_cxx::
             __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
             ::operator->(&local_90);
    dVar12 = ppVar8->first;
    ppVar8 = __gnu_cxx::
             __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
             ::operator->(&end);
    if ((dVar12 != ppVar8->first) || (NAN(dVar12) || NAN(ppVar8->first))) {
      local_a0 = end._M_current;
      local_a8 = local_90._M_current;
      dVar7 = std::
              distance<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                        ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                          )end._M_current,local_90);
      ppVar2 = r.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (1 < dVar7) {
        local_b0._M_current = end._M_current;
        local_b8._M_current = local_90._M_current;
        ppVar8 = __gnu_cxx::
                 __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                 ::operator->(&end);
        dVar12 = ppVar8->first;
        ppVar8 = __gnu_cxx::
                 __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                 ::operator->(&local_90);
        random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                  (local_b0,local_b8,(random_engine *)ppVar2,dVar12,ppVar8->first);
      }
      end._M_current = local_90._M_current;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
    ::operator++(&local_90);
  }
  local_c0 = end._M_current;
  local_c8 = next._M_current;
  dVar7 = std::
          distance<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                    ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                      )end._M_current,next);
  if (1 < dVar7) {
    local_d0._M_current =
         (pair<double,_int> *)
         std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                   ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                    local_38);
    bVar3 = __gnu_cxx::
            operator==<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                      (&end,&local_d0);
    ppVar2 = r.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar6 = end;
    _Var1 = next;
    if (bVar3) {
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
               ::operator->(&end);
      dVar12 = ppVar8->first;
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
               ::operator->(&end);
      random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                  )iVar6._M_current,_Var1,(random_engine *)ppVar2,dVar12,ppVar8->first + 1.0);
    }
    else {
      pvVar5 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::front
                         ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           *)local_38);
      dVar12 = pvVar5->first;
      iVar6 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                        ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )local_38);
      dVar7 = std::
              distance<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                        ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                          )iVar6._M_current,
                         (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                          )end._M_current);
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
               ::operator->(&end);
      p2y = ppVar8->first;
      iVar6 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                        ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )local_38);
      iVar9 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                        ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *
                         )local_38);
      value_00 = std::
                 distance<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                           ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                             )iVar6._M_current,
                            (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                             )iVar9._M_current);
      dVar12 = linearize<long,double>(0,dVar12,dVar7,p2y,value_00);
      ppVar2 = r.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar6 = end;
      _Var1 = next;
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
               ::operator->(&end);
      random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                  )iVar6._M_current,_Var1,(random_engine *)ppVar2,ppVar8->first,dVar12);
    }
  }
  iVar6 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                    ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                     local_38);
  iVar9 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                    ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                     local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,baryonyx::itm::default_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>
            (iVar6._M_current,iVar9._M_current);
  for (div._0_4_ = 0; div._0_4_ != n; div._0_4_ = div._0_4_ + 1) {
    pvVar5 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        local_38,(long)div._0_4_);
    dVar12 = pvVar5->first;
    pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->linear_elements,(long)div._0_4_);
    *pdVar4 = dVar12;
  }
  __first = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(&this->linear_elements);
  pdVar10 = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(&this->linear_elements);
  pdVar11 = std::max_element<double*>(__first,pdVar10 + n);
  dVar12 = *pdVar11;
  bVar3 = std::isnormal(dVar12);
  if (bVar3) {
    for (local_13c = 0; local_13c != n; local_13c = local_13c + 1) {
      pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         (&this->linear_elements,(long)local_13c);
      *pdVar4 = *pdVar4 / dVar12;
    }
  }
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::~vector
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)local_38);
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        auto begin = r.begin();
        auto end = r.end();
        auto next = r.begin()++;
        for (; next != end; ++next) {
            if (next->first != begin->first) {
                if (std::distance(begin, next) > 1)
                    random_epsilon_unique(
                      begin, next, rng, begin->first, next->first);

                begin = next;
            }
        }

        if (std::distance(begin, end) > 1) {
            if (begin == r.begin()) {
                random_epsilon_unique(
                  begin, end, rng, begin->first, begin->first + 1);
            } else {
                auto value = linearize(std::ptrdiff_t(0),
                                       r.front().first,
                                       std::distance(r.begin(), begin),
                                       begin->first,
                                       std::distance(r.begin(), r.end()));

                random_epsilon_unique(begin, end, rng, begin->first, value);
            }
        }

        // Reorder the vector according to the variable index, so, it
        // restores the initial order.

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.second < rhs.second;
        });

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;

        // Finally we compute the l+oo norm.

        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);
        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }